

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::arraytype<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  Ok *pOVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  allocator<char> local_141;
  string local_140;
  Err local_120;
  _Optional_base<wasm::Ok,_true,_true> local_fb;
  allocator<char> local_f9;
  undefined1 local_f8 [5];
  optional<wasm::Ok> array;
  Err local_d8;
  uint local_b4;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> namedFields;
  ParseDeclsCtx *ctx_local;
  
  expected = sv("array",5);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    fields<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)__return_storage_ptr___00,ctx);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)local_78,(Result<wasm::Ok> *)__return_storage_ptr___00);
    local_90 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_78);
    bVar1 = local_90 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_b0,local_90);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_b0);
      wasm::Err::~Err(&local_b0);
    }
    local_b4 = (uint)bVar1;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_78);
    if (local_b4 == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        pOVar2 = Result<wasm::Ok>::operator*
                           ((Result<wasm::Ok> *)
                            ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        local_fb._M_payload.super__Optional_payload_base<wasm::Ok> =
             (_Optional_payload<wasm::Ok,_true,_true,_true>)
             NullTypeParserCtx::makeArray((NullTypeParserCtx *)ctx,pOVar2);
        bVar1 = std::optional::operator_cast_to_bool((optional *)&local_fb);
        if (bVar1) {
          pOVar2 = std::optional<wasm::Ok>::operator*((optional<wasm::Ok> *)&local_fb);
          MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok&>(__return_storage_ptr__,pOVar2);
          local_b4 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,"expected exactly one field in array definition",
                     &local_141);
          Lexer::err(&local_120,&ctx->in,&local_140);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_120);
          wasm::Err::~Err(&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          std::allocator<char>::~allocator(&local_141);
          local_b4 = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f8,"expected end of array definition",&local_f9);
        Lexer::err(&local_d8,&ctx->in,(string *)local_f8);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_d8);
        wasm::Err::~Err(&local_d8);
        std::__cxx11::string::~string((string *)local_f8);
        std::allocator<char>::~allocator(&local_f9);
        local_b4 = 1;
      }
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  else {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ArrayT> arraytype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("array"sv)) {
    return {};
  }
  auto namedFields = fields(ctx);
  CHECK_ERR(namedFields);
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of array definition");
  }

  if (auto array = ctx.makeArray(*namedFields)) {
    return *array;
  }
  return ctx.in.err("expected exactly one field in array definition");
}